

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_replaceRangeAString(AString *str,size_t index,size_t count,AString *rep)

{
  AString *rep_local;
  size_t count_local;
  size_t index_local;
  AString *str_local;
  
  if (rep == (AString *)0x0) {
    str_local._4_4_ = AString_replaceRangeCString(str,index,count,(char *)0x0,0);
  }
  else {
    str_local._4_4_ = AString_replaceRangeCString(str,index,count,rep->buffer,rep->size);
  }
  return str_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeAString(struct AString *str, size_t index, size_t count, const struct AString *rep)
{
    if(rep == nullptr)
        return AString_replaceRangeCString(str, index, count, nullptr, 0);
    else
        return AString_replaceRangeCString(str, index, count, rep->buffer, rep->size);
}